

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ReduceSumLayerParams::SharedCtor(ReduceSumLayerParams *this)

{
  ReduceSumLayerParams *this_local;
  
  memset(&this->keepdims_,0,2);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void ReduceSumLayerParams::SharedCtor() {
  ::memset(&keepdims_, 0, reinterpret_cast<char*>(&reduceall_) -
    reinterpret_cast<char*>(&keepdims_) + sizeof(reduceall_));
  _cached_size_ = 0;
}